

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::detail::Format_impl(string *result,const_iterator *it,const_iterator *itend)

{
  char *pcVar1;
  
  do {
    while( true ) {
      pcVar1 = it->_M_current;
      if (pcVar1 == itend->_M_current) {
        return;
      }
      if (*pcVar1 == '%') break;
LAB_00109342:
      std::__cxx11::string::push_back((char)result);
      it->_M_current = it->_M_current + 1;
    }
    it->_M_current = pcVar1 + 1;
    if (pcVar1[1] == '%') goto LAB_00109342;
    if (pcVar1 + 1 != itend->_M_current) {
      AddArg(result,it,itend);
    }
  } while( true );
}

Assistant:

inline void Format_impl(std::string& result,
						std::string::const_iterator& it, std::string::const_iterator& itend)
{
	while (it != itend)
	{
		switch (*it)
		{
		case '%':
			++it;
			if (*it != '%')
			{
				if (it != itend)
					AddArg(result, it, itend);
				break;
			}
			[[fallthrough]];
		default:
			result += *it;
			++it;
		}
	}
}